

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_free_modules(JSContext *ctx,JSFreeModuleEnum flag)

{
  int in_ESI;
  JSModuleDef *in_RDI;
  JSModuleDef *m;
  list_head *el1;
  list_head *el;
  undefined1 *local_20;
  undefined1 *local_18;
  
  local_18 = *(undefined1 **)&in_RDI[2].import_entries_count;
  local_20 = *(undefined1 **)(local_18 + 8);
  while ((JSImportEntry **)local_18 != &in_RDI[2].import_entries) {
    if (((in_ESI == 0) || ((in_ESI == 1 && ((char)*(undefined8 *)(local_18 + 0x78) == '\0')))) ||
       ((in_ESI == 2 && ((char)((ulong)*(undefined8 *)(local_18 + 0x78) >> 0x18) == '\0')))) {
      js_free_module_def((JSContext *)m,in_RDI);
    }
    local_18 = local_20;
    local_20 = *(undefined1 **)(local_20 + 8);
  }
  return;
}

Assistant:

static void js_free_modules(JSContext *ctx, JSFreeModuleEnum flag)
{
    struct list_head *el, *el1;
    list_for_each_safe(el, el1, &ctx->loaded_modules) {
        JSModuleDef *m = list_entry(el, JSModuleDef, link);
        if (flag == JS_FREE_MODULE_ALL ||
            (flag == JS_FREE_MODULE_NOT_RESOLVED && !m->resolved) ||
            (flag == JS_FREE_MODULE_NOT_EVALUATED && !m->evaluated)) {
            js_free_module_def(ctx, m);
        }
    }
}